

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

void recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_udp_t *unaff_RBX;
  uv_udp_t *puVar6;
  uv_buf_t uStack_670;
  sockaddr sStack_660;
  undefined2 uStack_650;
  undefined1 uStack_64e;
  undefined5 uStack_64d;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined6 uStack_608;
  undefined2 uStack_602;
  undefined6 uStack_600;
  undefined8 uStack_5fa;
  undefined1 auStack_5f0 [536];
  uv_loop_t *puStack_3d8;
  code *pcStack_3d0;
  uv_buf_t uStack_3c8;
  sockaddr_in sStack_3b8;
  uv_udp_t uStack_3a8;
  uv_udp_t uStack_2d0;
  uv_loop_t *puStack_1f8;
  sockaddr_in sStack_1e8;
  uv_udp_t uStack_1d8;
  uv_loop_t *puStack_100;
  uv_udp_t uStack_f8;
  uv_udp_t *puStack_20;
  
  if (nread < 0) {
    recv_cb_cold_7();
    puVar6 = handle;
LAB_001788db:
    recv_cb_cold_1();
LAB_001788e0:
    recv_cb_cold_5();
LAB_001788e5:
    recv_cb_cold_2();
LAB_001788ea:
    recv_cb_cold_3();
LAB_001788ef:
    recv_cb_cold_4();
    handle = puVar6;
  }
  else {
    if (nread != 0) {
      puVar6 = handle;
      if (flags != 0) goto LAB_001788db;
      if (addr == (sockaddr *)0x0) goto LAB_001788e0;
      if (nread != 4) goto LAB_001788e5;
      if (*(int *)buf->base != 0x474e4950) goto LAB_001788ea;
      iVar1 = uv_udp_recv_stop(handle);
      unaff_RBX = handle;
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)handle,close_cb);
        return;
      }
      goto LAB_001788ef;
    }
    if (addr == (sockaddr *)0x0) {
      return;
    }
  }
  iVar1 = (int)nread;
  recv_cb_cold_6();
  if (handle == (uv_udp_t *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close((uv_handle_t *)(handle->u).reserved[2],close_cb);
    return;
  }
  send_cb_cold_1();
  puStack_100 = (uv_loop_t *)0x178932;
  puStack_20 = unaff_RBX;
  uVar2 = create_udp_socket();
  puStack_100 = (uv_loop_t *)0x178939;
  uVar3 = create_udp_socket();
  puVar5 = (uv_loop_t *)(ulong)uVar3;
  puStack_100 = (uv_loop_t *)0x178940;
  puVar4 = uv_default_loop();
  puStack_100 = (uv_loop_t *)0x17894b;
  iVar1 = uv_udp_init(puVar4,&uStack_f8);
  if (iVar1 == 0) {
    puStack_100 = (uv_loop_t *)0x17895d;
    iVar1 = uv_udp_open(&uStack_f8,uVar2);
    if (iVar1 != 0) goto LAB_001789d9;
    puStack_100 = (uv_loop_t *)0x17896b;
    iVar1 = uv_udp_open(&uStack_f8,uVar3);
    if (iVar1 != -0x10) goto LAB_001789de;
    puStack_100 = (uv_loop_t *)0x178977;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_001789e3;
    puStack_100 = (uv_loop_t *)0x178985;
    uv_close((uv_handle_t *)&uStack_f8,(uv_close_cb)0x0);
    puStack_100 = (uv_loop_t *)0x17898a;
    puVar4 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x178994;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_100 = (uv_loop_t *)0x178999;
    puVar5 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1789ad;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_100 = (uv_loop_t *)0x1789b7;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_100 = (uv_loop_t *)0x1789bc;
    puVar4 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1789c4;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_100 = (uv_loop_t *)0x1789d9;
    run_test_udp_open_twice_cold_1();
LAB_001789d9:
    puStack_100 = (uv_loop_t *)0x1789de;
    run_test_udp_open_twice_cold_2();
LAB_001789de:
    puStack_100 = (uv_loop_t *)0x1789e3;
    run_test_udp_open_twice_cold_3();
LAB_001789e3:
    puStack_100 = (uv_loop_t *)0x1789e8;
    run_test_udp_open_twice_cold_4();
  }
  puStack_100 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_1f8 = (uv_loop_t *)0x178a0b;
  puStack_100 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1e8);
  if (iVar1 == 0) {
    puStack_1f8 = (uv_loop_t *)0x178a18;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    puStack_1f8 = (uv_loop_t *)0x178a2b;
    iVar1 = bind(uVar3,(sockaddr *)&sStack_1e8,0x10);
    if (iVar1 != 0) goto LAB_00178adc;
    puStack_1f8 = (uv_loop_t *)0x178a38;
    puVar4 = uv_default_loop();
    puStack_1f8 = (uv_loop_t *)0x178a45;
    iVar1 = uv_udp_init(puVar4,&uStack_1d8);
    if (iVar1 != 0) goto LAB_00178ae1;
    puStack_1f8 = (uv_loop_t *)0x178a59;
    iVar1 = uv_udp_open(&uStack_1d8,uVar3);
    if (iVar1 != 0) goto LAB_00178ae6;
    puStack_1f8 = (uv_loop_t *)0x178a79;
    iVar1 = uv_udp_recv_start(&uStack_1d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178aeb;
    puStack_1f8 = (uv_loop_t *)0x178a89;
    uv_close((uv_handle_t *)&uStack_1d8,(uv_close_cb)0x0);
    puStack_1f8 = (uv_loop_t *)0x178a8e;
    puVar4 = uv_default_loop();
    puStack_1f8 = (uv_loop_t *)0x178a98;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_1f8 = (uv_loop_t *)0x178a9d;
    puVar5 = uv_default_loop();
    puStack_1f8 = (uv_loop_t *)0x178ab1;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_1f8 = (uv_loop_t *)0x178abb;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_1f8 = (uv_loop_t *)0x178ac0;
    puVar4 = uv_default_loop();
    puStack_1f8 = (uv_loop_t *)0x178ac8;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_1f8 = (uv_loop_t *)0x178adc;
    run_test_udp_open_bound_cold_1();
LAB_00178adc:
    puStack_1f8 = (uv_loop_t *)0x178ae1;
    run_test_udp_open_bound_cold_2();
LAB_00178ae1:
    puStack_1f8 = (uv_loop_t *)0x178ae6;
    run_test_udp_open_bound_cold_3();
LAB_00178ae6:
    puStack_1f8 = (uv_loop_t *)0x178aeb;
    run_test_udp_open_bound_cold_4();
LAB_00178aeb:
    puStack_1f8 = (uv_loop_t *)0x178af0;
    run_test_udp_open_bound_cold_5();
  }
  puStack_1f8 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3d0 = (code *)0x178b0e;
  puStack_1f8 = puVar5;
  uStack_3c8 = uv_buf_init("PING",4);
  pcStack_3d0 = (code *)0x178b2d;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3b8);
  if (iVar1 == 0) {
    pcStack_3d0 = (code *)0x178b3a;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    pcStack_3d0 = (code *)0x178b41;
    puVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x178b4e;
    iVar1 = uv_udp_init(puVar4,&uStack_3a8);
    if (iVar1 != 0) goto LAB_00178c7a;
    pcStack_3d0 = (code *)0x178b67;
    iVar1 = connect(uVar3,(sockaddr *)&sStack_3b8,0x10);
    if (iVar1 != 0) goto LAB_00178c7f;
    pcStack_3d0 = (code *)0x178b7b;
    iVar1 = uv_udp_open(&uStack_3a8,uVar3);
    if (iVar1 != 0) goto LAB_00178c84;
    pcStack_3d0 = (code *)0x178b88;
    puVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x178b98;
    iVar1 = uv_udp_init(puVar4,&uStack_2d0);
    if (iVar1 != 0) goto LAB_00178c89;
    pcStack_3d0 = (code *)0x178bb4;
    iVar1 = uv_udp_bind(&uStack_2d0,(sockaddr *)&sStack_3b8,0);
    if (iVar1 != 0) goto LAB_00178c8e;
    pcStack_3d0 = (code *)0x178bd7;
    iVar1 = uv_udp_recv_start(&uStack_2d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178c93;
    pcStack_3d0 = (code *)0x178c02;
    iVar1 = uv_udp_send(&send_req,&uStack_3a8,&uStack_3c8,1,(sockaddr *)0x0,send_cb);
    if (iVar1 != 0) goto LAB_00178c98;
    pcStack_3d0 = (code *)0x178c0f;
    puVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x178c19;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00178c9d;
    if (close_cb_called != 2) goto LAB_00178ca2;
    if ((void *)uStack_3a8.send_queue_size != (void *)0x0) goto LAB_00178ca7;
    pcStack_3d0 = (code *)0x178c3b;
    puVar5 = uv_default_loop();
    pcStack_3d0 = (code *)0x178c4f;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStack_3d0 = (code *)0x178c59;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_3d0 = (code *)0x178c5e;
    puVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x178c66;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_3d0 = (code *)0x178c7a;
    run_test_udp_open_connect_cold_1();
LAB_00178c7a:
    pcStack_3d0 = (code *)0x178c7f;
    run_test_udp_open_connect_cold_2();
LAB_00178c7f:
    pcStack_3d0 = (code *)0x178c84;
    run_test_udp_open_connect_cold_3();
LAB_00178c84:
    pcStack_3d0 = (code *)0x178c89;
    run_test_udp_open_connect_cold_4();
LAB_00178c89:
    pcStack_3d0 = (code *)0x178c8e;
    run_test_udp_open_connect_cold_5();
LAB_00178c8e:
    pcStack_3d0 = (code *)0x178c93;
    run_test_udp_open_connect_cold_6();
LAB_00178c93:
    pcStack_3d0 = (code *)0x178c98;
    run_test_udp_open_connect_cold_7();
LAB_00178c98:
    pcStack_3d0 = (code *)0x178c9d;
    run_test_udp_open_connect_cold_8();
LAB_00178c9d:
    pcStack_3d0 = (code *)0x178ca2;
    run_test_udp_open_connect_cold_9();
LAB_00178ca2:
    pcStack_3d0 = (code *)0x178ca7;
    run_test_udp_open_connect_cold_10();
LAB_00178ca7:
    pcStack_3d0 = (code *)0x178cac;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3d0 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  puStack_3d8 = puVar5;
  pcStack_3d0 = (code *)(ulong)uVar2;
  uStack_670 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_64d = 0;
  uStack_648 = 0;
  uStack_640 = 0;
  uStack_638 = 0;
  uStack_630 = 0;
  uStack_628 = 0;
  uStack_620 = 0;
  uStack_618 = 0;
  uStack_610 = 0;
  uStack_608 = 0;
  uStack_602 = 0;
  uStack_600 = 0;
  uStack_5fa = 0;
  sStack_660.sa_family = 1;
  builtin_strncpy(sStack_660.sa_data,"/tmp/uv-test-s",0xe);
  uStack_650 = 0x636f;
  uStack_64e = 0x6b;
  puVar4 = (uv_loop_t *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00178e45:
    run_test_udp_send_unix_cold_2();
LAB_00178e4a:
    run_test_udp_send_unix_cold_3();
LAB_00178e4f:
    run_test_udp_send_unix_cold_4();
LAB_00178e54:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = bind(uVar2,&sStack_660,0x6e);
    if (iVar1 != 0) goto LAB_00178e45;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00178e4a;
    puVar4 = puVar5;
    iVar1 = uv_udp_init(puVar5,(uv_udp_t *)auStack_5f0);
    if (iVar1 != 0) goto LAB_00178e4f;
    puVar4 = (uv_loop_t *)auStack_5f0;
    iVar1 = uv_udp_open((uv_udp_t *)puVar4,uVar2);
    if (iVar1 != 0) goto LAB_00178e54;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = (uv_loop_t *)(auStack_5f0 + 0xd8);
    iVar1 = uv_udp_send((uv_udp_send_t *)puVar4,(uv_udp_t *)auStack_5f0,&uStack_670,1,
                        (sockaddr *)&sStack_660,(uv_udp_send_cb)0x0);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)auStack_5f0,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00178e5e;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00178e5e:
  run_test_udp_send_unix_cold_7();
  if (puVar4 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return;
}

Assistant:

static void recv_cb(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  uv_handle_type pending;
  uv_pipe_t* pipe;
  int r;
  union handles* recv;

  pipe = (uv_pipe_t*) handle;
  ASSERT(pipe == &ctx.channel);

  do {
    if (++recv_cb_count == 1) {
      recv = &ctx.recv;
    } else {
      recv = &ctx.recv2;
    }

    /* Depending on the OS, the final recv_cb can be called after
     * the child process has terminated which can result in nread
     * being UV_EOF instead of the number of bytes read.  Since
     * the other end of the pipe has closed this UV_EOF is an
     * acceptable value. */
    if (nread == UV_EOF) {
      /* UV_EOF is only acceptable for the final recv_cb call */
      ASSERT(recv_cb_count == 2);
    } else {
      ASSERT(nread >= 0);
      ASSERT(uv_pipe_pending_count(pipe) > 0);

      pending = uv_pipe_pending_type(pipe);
      ASSERT(pending == ctx.expected_type);

      if (pending == UV_NAMED_PIPE)
        r = uv_pipe_init(ctx.channel.loop, &recv->pipe, 0);
      else if (pending == UV_TCP)
        r = uv_tcp_init(ctx.channel.loop, &recv->tcp);
      else
        abort();
      ASSERT(r == 0);

      r = uv_accept(handle, &recv->stream);
      ASSERT(r == 0);
    }
  } while (uv_pipe_pending_count(pipe) > 0);

  /* Close after two writes received */
  if (recv_cb_count == 2) {
    uv_close((uv_handle_t*)&ctx.channel, NULL);
  }
}